

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

string * __thiscall
iDynTree::KinDynComputations::getDescriptionOfDegreesOfFreedom_abi_cxx11_
          (string *__return_storage_ptr__,KinDynComputations *this)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar3 = 0;
  while( true ) {
    uVar1 = getNrOfDegreesOfFreedom(this);
    if (uVar1 <= uVar3) break;
    poVar2 = std::operator<<(local_1a8,"DOF Index: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," Name: ");
    getDescriptionOfDegreeOfFreedom_abi_cxx11_(&local_1d8,this,(int)uVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string KinDynComputations::getDescriptionOfDegreesOfFreedom() const
{
    std::stringstream ss;

    for(unsigned int dof = 0; dof < this->getNrOfDegreesOfFreedom(); dof++ )
    {
        ss << "DOF Index: " << dof << " Name: " <<  this->getDescriptionOfDegreeOfFreedom(dof) << std::endl;
    }

    return ss.str();
}